

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * testing::internal::FormatFileLocation_abi_cxx11_(char *file,int line)

{
  int in_EDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string file_name;
  char *local_c8;
  string local_b0 [8];
  int *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined4 local_50;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  
  local_c8 = in_RSI;
  if (in_RSI == (char *)0x0) {
    local_c8 = "unknown file";
  }
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,local_c8,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (local_14 < 0) {
    std::operator+(in_RDI,&local_38,":");
  }
  else {
    std::operator+(&local_90,&local_38,":");
    StreamableToString<int>(in_stack_ffffffffffffff58);
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    std::operator+(in_RDI,&local_70,":");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  local_50 = 1;
  std::__cxx11::string::~string((string *)&local_38);
  return in_RDI;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}